

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_ellswift_xelligatorswift_var
               (uchar *u32,secp256k1_fe *t,secp256k1_fe *x,secp256k1_sha256 *hasher)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 in_RCX;
  secp256k1_sha256 *in_RDX;
  uchar *in_RSI;
  uchar *in_RDI;
  secp256k1_fe u;
  int branch;
  uint32_t cnt;
  int branches_left;
  uchar branch_hash [32];
  int in_stack_000000c4;
  secp256k1_fe *in_stack_000000c8;
  secp256k1_fe *in_stack_000000d0;
  secp256k1_fe *in_stack_000000d8;
  secp256k1_fe local_80;
  uint local_54;
  int local_50;
  uint local_4c;
  byte local_48 [44];
  uint32_t cnt_00;
  
  local_4c = 0;
  local_50 = 0;
  unique0x1000013c = in_RCX;
  do {
    uVar1 = stack0xffffffffffffffe0;
    if (local_4c == 0) {
      local_50 = local_50 + 1;
      cnt_00 = (uint32_t)((ulong)stack0xffffffffffffffe0 >> 0x20);
      secp256k1_ellswift_prng(in_RSI,in_RDX,cnt_00);
      stack0xffffffffffffffe0 = uVar1;
      local_4c = 0x40;
    }
    uVar1 = stack0xffffffffffffffe0;
    local_4c = local_4c - 1;
    local_54 = (int)(uint)local_48[(int)local_4c >> 1] >> (sbyte)((local_4c & 1) << 2) & 7;
    local_50 = local_50 + 1;
    cnt_00 = (uint32_t)((ulong)stack0xffffffffffffffe0 >> 0x20);
    secp256k1_ellswift_prng(in_RSI,in_RDX,cnt_00);
    stack0xffffffffffffffe0 = uVar1;
    secp256k1_fe_impl_set_b32_mod(&local_80,in_RDI);
    iVar2 = secp256k1_ellswift_xswiftec_inv_var
                      (in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
  } while (iVar2 == 0);
  return;
}

Assistant:

static void secp256k1_ellswift_xelligatorswift_var(unsigned char *u32, secp256k1_fe *t, const secp256k1_fe *x, const secp256k1_sha256 *hasher) {
    /* Pool of 3-bit branch values. */
    unsigned char branch_hash[32];
    /* Number of 3-bit values in branch_hash left. */
    int branches_left = 0;
    /* Field elements u and branch values are extracted from RNG based on hasher for consecutive
     * values of cnt. cnt==0 is first used to populate a pool of 64 4-bit branch values. The 64
     * cnt values that follow are used to generate field elements u. cnt==65 (and multiples
     * thereof) are used to repopulate the pool and start over, if that were ever necessary.
     * On average, 4 iterations are needed. */
    uint32_t cnt = 0;
    while (1) {
        int branch;
        secp256k1_fe u;
        /* If the pool of branch values is empty, populate it. */
        if (branches_left == 0) {
            secp256k1_ellswift_prng(branch_hash, hasher, cnt++);
            branches_left = 64;
        }
        /* Take a 3-bit branch value from the branch pool (top bit is discarded). */
        --branches_left;
        branch = (branch_hash[branches_left >> 1] >> ((branches_left & 1) << 2)) & 7;
        /* Compute a new u value by hashing. */
        secp256k1_ellswift_prng(u32, hasher, cnt++);
        /* overflow is not a problem (we prefer uniform u32 over uniform u). */
        secp256k1_fe_set_b32_mod(&u, u32);
        /* Since u is the output of a hash, it should practically never be 0. We could apply the
         * u=0 to u=1 correction here too to deal with that case still, but it's such a low
         * probability event that we do not bother. */
#ifdef VERIFY
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(&u));
#endif
        /* Find a remainder t, and return it if found. */
        if (EXPECT(secp256k1_ellswift_xswiftec_inv_var(t, x, &u, branch), 0)) break;
    }
}